

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::render
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,TagBit *tag,
          TagBit *end,SizeT offset,SizeT end_offset)

{
  TagType TVar1;
  VariableTag *pVVar2;
  MathTag *tag_00;
  SuperVariableTag *tag_01;
  InLineIfTag *tag_02;
  LoopTag *tag_03;
  IfTag *tag_04;
  uint local_24;
  SizeT end_offset_local;
  SizeT offset_local;
  TagBit *end_local;
  TagBit *tag_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  local_24 = offset;
  _end_offset_local = end;
  tag_local = (TagBit *)this;
  for (end_local = tag; end_local < _end_offset_local; end_local = end_local + 1) {
    TVar1 = Tags::TagBit::GetType(end_local);
    switch(TVar1) {
    case Variable:
      pVVar2 = Tags::TagBit::GetVariableTag(end_local);
      renderVariable(this,pVVar2,&local_24);
      break;
    case RawVariable:
      pVVar2 = Tags::TagBit::GetVariableTag(end_local);
      renderRawVariable(this,pVVar2,&local_24);
      break;
    case Math:
      tag_00 = Tags::TagBit::GetMathTag(end_local);
      renderMath(this,tag_00,&local_24);
      break;
    case SuperVariable:
      tag_01 = Tags::TagBit::GetSuperVariableTag(end_local);
      renderSuperVariable(this,tag_01,&local_24);
      break;
    case InLineIf:
      tag_02 = Tags::TagBit::GetInLineIfTag(end_local);
      renderInLineIf(this,tag_02,&local_24);
      break;
    case Loop:
      tag_03 = Tags::TagBit::GetLoopTag(end_local);
      renderLoop(this,tag_03,&local_24);
      break;
    case If:
      tag_04 = Tags::TagBit::GetIfTag(end_local);
      renderIf(this,tag_04,&local_24);
    }
  }
  StringStream<char>::Write(this->stream_,this->content_ + local_24,end_offset - local_24);
  return;
}

Assistant:

void render(const TagBit *tag, const TagBit *end, SizeT offset, SizeT end_offset) const {
        while (tag < end) {
            switch (tag->GetType()) {
                case TagType::Variable: {
                    renderVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::RawVariable: {
                    renderRawVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::Math: {
                    renderMath(tag->GetMathTag(), offset);
                    break;
                }

                case TagType::SuperVariable: {
                    renderSuperVariable(tag->GetSuperVariableTag(), offset);
                    break;
                }

                case TagType::InLineIf: {
                    renderInLineIf(tag->GetInLineIfTag(), offset);
                    break;
                }

                case TagType::Loop: {
                    renderLoop(tag->GetLoopTag(), offset);
                    break;
                }

                case TagType::If: {
                    renderIf(tag->GetIfTag(), offset);
                    break;
                }

                default: {
                }
            }

            ++tag;
        }

        stream_->Write((content_ + offset), (end_offset - offset));
    }